

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void testExistingStreamsUTF8(string *tempDir)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  pointer pcVar5;
  long *plVar6;
  char cVar7;
  Rgba *pRVar8;
  int *piVar9;
  ulong uVar10;
  int h;
  half *phVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  string outfn;
  RgbaOutputFile out;
  Header header;
  Array2D<Imf_3_4::Rgba> p1;
  long *local_e0 [2];
  long local_d0 [2];
  void *local_c0;
  long local_b8;
  long local_b0;
  Rgba *local_a8;
  Rgba local_a0 [3];
  Rgba local_88 [8];
  Array2D<Imf_3_4::Rgba> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  cVar7 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  iVar13 = (int)cVar7;
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_48._sizeX = 0xed;
  local_48._sizeY = 0x77;
  pRVar8 = (Rgba *)operator_new__(0x37158);
  local_48._data = pRVar8;
  anon_unknown.dwarf_156c2f::fillPixels1(&local_48,iVar13,h);
  local_e0[0] = local_d0;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  remove((char *)local_e0[0]);
  local_a0[0].r._h = 0;
  local_a0[0].g._h = 0;
  local_a0[0].b._h = 0;
  local_a0[0].a._h = 0;
  Imf_3_4::Header::Header
            ((Header *)local_88,0x77,0xed,1.0,(Vec2 *)local_a0,1.0,INCREASING_Y,NO_COMPRESSION);
  plVar6 = local_e0[0];
  iVar13 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_a0,(char *)plVar6,(Header *)local_88,WRITE_RGBA,iVar13);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_a0,(ulong)pRVar8,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_a0);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_a0);
  Imf_3_4::Header::~Header((Header *)local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
  plVar6 = local_e0[0];
  iVar13 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_88,(char *)plVar6,iVar13);
  local_a8 = pRVar8;
  piVar9 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar13 = *piVar9;
  lVar12 = (long)piVar9[2] - (long)iVar13;
  uVar1 = lVar12 + 1;
  iVar4 = piVar9[3];
  lVar15 = (long)piVar9[1];
  local_b0 = iVar4 - lVar15;
  uVar10 = (local_b0 + 1) * uVar1;
  local_c0 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 * 8);
  local_b8 = lVar15;
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_88,(long)local_c0 + (long)iVar13 * -8 + -lVar15 * uVar1 * 8,1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_88,piVar9[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
  pRVar8 = local_a8;
  if (-1 < (int)local_b0) {
    phVar11 = &local_a8->a;
    lVar15 = (long)local_c0 + 6;
    uVar10 = 0;
    do {
      if (-1 < (int)lVar12) {
        uVar14 = 0;
        do {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar15 + -6 + uVar14 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table + (ulong)phVar11[uVar14 * 4 + -3]._h * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].r == p1[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x470,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar15 + -4 + uVar14 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table + (ulong)phVar11[uVar14 * 4 + -2]._h * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].g == p1[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x471,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar15 + -2 + uVar14 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table + (ulong)phVar11[uVar14 * 4 + -1]._h * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].b == p1[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x472,"void testExistingStreamsUTF8(const std::string &)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(lVar15 + uVar14 * 8) * 4);
          pfVar2 = (float *)(_imath_half_to_float_table + (ulong)phVar11[uVar14 * 4]._h * 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
            __assert_fail("p2[y][x].a == p1[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                          ,0x473,"void testExistingStreamsUTF8(const std::string &)");
          }
          uVar14 = uVar14 + 1;
        } while ((uVar1 & 0xffffffff) != uVar14);
      }
      uVar10 = uVar10 + 1;
      phVar11 = phVar11 + 0x1dc;
      lVar15 = lVar15 + uVar1 * 8;
    } while (uVar10 != (iVar4 - (int)local_b8) + 1);
  }
  operator_delete__(local_c0);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_88);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  remove((char *)local_e0[0]);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  operator_delete__(pRVar8);
  return;
}

Assistant:

void
testExistingStreamsUTF8 (const std::string& tempDir)
{

    cout << "Testing reading and writing using existing streams" << endl;

    const int W = 119;
    const int H = 237;
    Array2D<Rgba> p1 (H, W);

    fillPixels1 (p1, W, H);

    // per google translate, image in Japanese
    std::string   outfn = tempDir + "画像.exr";

    {
        cout << "writing";
#ifdef _WIN32
        _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
        remove (outfn.c_str ());
#endif
        Header      header (
            W,
            H,
            1,
            IMATH_NAMESPACE::V2f (0, 0),
            1,
            INCREASING_Y,
            NO_COMPRESSION);

        RgbaOutputFile out (
            outfn.c_str (),
            header,
            WRITE_RGBA);

        out.setFrameBuffer (&p1[0][0], 1, W);
        out.writePixels (H);
    }

    {
        cout << ", reading";
        RgbaInputFile in (outfn.c_str ());
        const Box2i& dw = in.dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        cout << ", comparing";
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (p2[y][x].r == p1[y][x].r);
                assert (p2[y][x].g == p1[y][x].g);
                assert (p2[y][x].b == p1[y][x].b);
                assert (p2[y][x].a == p1[y][x].a);
            }
        }
    }

    cout << endl;

#ifdef _WIN32
    _wremove (WidenFilename (outfn.c_str ()).c_str ());
#else
    remove (outfn.c_str ());
#endif
}